

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadStream.cpp
# Opt level: O0

void __thiscall ReadStream::ReadStream(ReadStream *this,string *filePath)

{
  byte bVar1;
  streamoff sVar2;
  ostream *poVar3;
  fpos local_38 [32];
  string *local_18;
  string *filePath_local;
  ReadStream *this_local;
  
  local_18 = filePath;
  filePath_local = (string *)this;
  std::ifstream::ifstream(this);
  this->fileIsOpen = false;
  this->size = 0;
  std::ifstream::open((string *)this,(_Ios_Openmode)filePath);
  std::istream::seekg((long)this,_S_beg);
  local_38._0_16_ = std::istream::tellg();
  sVar2 = std::fpos::operator_cast_to_long(local_38);
  this->size = (int)sVar2 << 4;
  std::istream::seekg((long)this,_S_beg);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Shortcut or Jump List file is not opened. ");
    poVar3 = std::operator<<(poVar3,
                             "Please check that you input correct path and start program again.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->fileIsOpen = true;
  }
  return;
}

Assistant:

ReadStream::ReadStream(std::string filePath) {
        f.open(filePath, std::ios::binary);
        f.seekg (0, std::ios::end);
        size = f.tellg() * 16;
        f.seekg (0, std::ios::beg);
        if(!f.is_open())
            cout << "Shortcut or Jump List file is not opened. "
                 << "Please check that you input correct path and start program again." << endl;
        else
            fileIsOpen = true;
    }